

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_start_and_close(void)

{
  char *path;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_loop_t *puVar3;
  size_t sVar4;
  uv_fs_event_t *loop_00;
  int in_ECX;
  int extraout_EDX;
  long lVar5;
  code *handle;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  size_t sStack_570;
  char acStack_568 [1032];
  uv_loop_t *puStack_160;
  undefined1 local_120 [136];
  
  loop = uv_default_loop();
  create_dir("watch_dir");
  handle = (code *)&stack0xffffffffffffff68;
  puVar3 = loop;
  iVar2 = uv_fs_event_init(loop,(uv_fs_event_t *)handle);
  if (iVar2 == 0) {
    handle = fs_event_cb_dir;
    puVar3 = (uv_loop_t *)&stack0xffffffffffffff68;
    in_ECX = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar3,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_0014f05b;
    handle = (code *)local_120;
    puVar3 = loop;
    iVar2 = uv_fs_event_init(loop,(uv_fs_event_t *)handle);
    if (iVar2 != 0) goto LAB_0014f060;
    handle = fs_event_cb_dir;
    puVar3 = (uv_loop_t *)local_120;
    in_ECX = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar3,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_0014f065;
    uv_close((uv_handle_t *)local_120,close_cb);
    uv_close((uv_handle_t *)&stack0xffffffffffffff68,close_cb);
    handle = (code *)0x0;
    puVar3 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_0014f06a;
    remove("watch_dir/");
    loop = uv_default_loop();
    uv_walk(loop,close_walk_cb,(void *)0x0);
    handle = (code *)0x0;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_0014f05b:
    run_test_fs_event_start_and_close_cold_2();
LAB_0014f060:
    run_test_fs_event_start_and_close_cold_3();
LAB_0014f065:
    run_test_fs_event_start_and_close_cold_4();
LAB_0014f06a:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == (uv_loop_t *)&fs_event) {
    if (in_ECX != 0) goto LAB_0014f0cf;
    if (extraout_EDX != 2) goto LAB_0014f0d4;
    iVar2 = strcmp((char *)handle,"file1");
    if (iVar2 != 0) goto LAB_0014f0d9;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0014f0cf:
    fs_event_cb_dir_cold_2();
LAB_0014f0d4:
    fs_event_cb_dir_cold_3();
LAB_0014f0d9:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_160 = loop;
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  do {
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    if (iVar2 != 0) {
LAB_0014f2d8:
      run_test_fs_event_getpath_cold_1();
      goto LAB_0014f2dd;
    }
    sStack_570 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    if (iVar2 != -0x16) {
LAB_0014f2d3:
      run_test_fs_event_getpath_cold_2();
      goto LAB_0014f2d8;
    }
    path = *(char **)((long)&DAT_001e1c10 + lVar5);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,path,0);
    if (iVar2 != 0) {
LAB_0014f2ce:
      run_test_fs_event_getpath_cold_3();
      goto LAB_0014f2d3;
    }
    sStack_570 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    sVar1 = sStack_570;
    if (iVar2 != -0x69) {
LAB_0014f2c9:
      run_test_fs_event_getpath_cold_4();
      goto LAB_0014f2ce;
    }
    if (0x3ff < sStack_570) {
LAB_0014f2c4:
      run_test_fs_event_getpath_cold_5();
      goto LAB_0014f2c9;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4 + 1) {
LAB_0014f2bf:
      run_test_fs_event_getpath_cold_6();
      goto LAB_0014f2c4;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    sVar1 = sStack_570;
    if (iVar2 != 0) {
LAB_0014f2ba:
      run_test_fs_event_getpath_cold_7();
      goto LAB_0014f2bf;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4) {
LAB_0014f2b5:
      run_test_fs_event_getpath_cold_8();
      goto LAB_0014f2ba;
    }
    iVar2 = strcmp(acStack_568,path);
    if (iVar2 != 0) {
LAB_0014f2b0:
      run_test_fs_event_getpath_cold_9();
      goto LAB_0014f2b5;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_0014f2ab:
      run_test_fs_event_getpath_cold_10();
      goto LAB_0014f2b0;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_0014f2ab;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  remove("watch_dir/");
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    return 0;
  }
LAB_0014f2dd:
  run_test_fs_event_getpath_cold_12();
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  loop_00 = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init((uv_loop_t *)loop_00,&fs_event);
  if (iVar2 == 0) {
    loop_00 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_0014f3da;
    loop_00 = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 != 0) goto LAB_0014f3df;
    loop_00 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_0014f3e4;
    loop_00 = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop_00 = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014f3ee;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_0014f3da:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_0014f3df:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_0014f3e4:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_0014f3ee:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing((uv_handle_t *)loop_00);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)loop_00,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}